

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::GetUpdateBatches
          (MutableS2ShapeIndex *this,
          vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
          *batches)

{
  bool bVar1;
  int iVar2;
  type this_00;
  reference pRVar3;
  size_type sVar4;
  S2Shape *pSVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  undefined1 auVar10 [16];
  S2LogMessage local_d8;
  S2LogMessageVoidify local_c1;
  BatchDescriptor local_c0;
  S2Shape *local_b8;
  S2Shape *shape_1;
  int id_1;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> batch_sizes;
  int kMaxUpdateBatches;
  size_t kTmpMemoryBudgetBytes;
  size_t kTmpBytesPerEdge;
  size_t kFinalBytesPerEdge;
  int num_edges;
  S2Shape *shape;
  int id;
  int num_edges_added;
  RemovedShape *pending_removal;
  iterator __end2;
  iterator __begin2;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *__range2;
  int num_edges_removed;
  vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
  *batches_local;
  MutableS2ShapeIndex *this_local;
  
  __range2._4_4_ = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pending_removals_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
              ::operator*(&this->pending_removals_);
    __end2 = std::
             vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
             ::begin(this_00);
    pending_removal =
         (RemovedShape *)
         std::
         vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
                                       *)&pending_removal), bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
               ::operator*(&__end2);
      sVar4 = std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>::size(&pRVar3->edges);
      __range2._4_4_ = __range2._4_4_ + (int)sVar4;
      __gnu_cxx::
      __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
      ::operator++(&__end2);
    }
  }
  shape._4_4_ = 0;
  for (shape._0_4_ = this->pending_additions_begin_;
      sVar4 = std::
              vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              ::size(&this->shapes_), (ulong)(long)(int)shape < sVar4; shape._0_4_ = (int)shape + 1)
  {
    pSVar5 = MutableS2ShapeIndex::shape(this,(int)shape);
    if (pSVar5 != (S2Shape *)0x0) {
      iVar2 = (*pSVar5->_vptr_S2Shape[2])();
      shape._4_4_ = iVar2 + shape._4_4_;
    }
  }
  iVar2 = __range2._4_4_ + shape._4_4_;
  uVar6 = (long)FLAGS_s2shape_index_tmp_memory_budget_mb * 0x100000;
  if ((ulong)((long)iVar2 * 200) < uVar6 ||
      (long)iVar2 * 200 + (long)FLAGS_s2shape_index_tmp_memory_budget_mb * -0x100000 == 0) {
    sVar4 = std::
            vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
            ::size(&this->shapes_);
    BatchDescriptor::BatchDescriptor
              ((BatchDescriptor *)
               ((long)&batch_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),(int)sVar4,iVar2);
    std::
    vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
    ::push_back(batches,(value_type *)
                        ((long)&batch_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_98);
    auVar10._8_4_ = (int)(uVar6 >> 0x20);
    auVar10._0_8_ = uVar6;
    auVar10._12_4_ = 0x45300000;
    GetBatchSizes(iVar2,100,8.0,200.0,
                  (auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0),
                  (vector<int,_std::allocator<int>_> *)local_98);
    kFinalBytesPerEdge._4_4_ = 0;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pending_removals_);
    if (bVar1) {
      kFinalBytesPerEdge._4_4_ = __range2._4_4_;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_98,0);
      if (*pvVar7 <= __range2._4_4_) {
        BatchDescriptor::BatchDescriptor
                  ((BatchDescriptor *)((long)&shape_1 + 4),this->pending_additions_begin_,
                   __range2._4_4_);
        std::
        vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
        ::push_back(batches,(value_type *)((long)&shape_1 + 4));
        kFinalBytesPerEdge._4_4_ = 0;
      }
    }
    for (shape_1._0_4_ = this->pending_additions_begin_; uVar6 = (ulong)(int)shape_1,
        sVar4 = std::
                vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                ::size(&this->shapes_), uVar6 < sVar4; shape_1._0_4_ = (int)shape_1 + 1) {
      local_b8 = MutableS2ShapeIndex::shape(this,(int)shape_1);
      if (local_b8 != (S2Shape *)0x0) {
        iVar2 = (*local_b8->_vptr_S2Shape[2])();
        kFinalBytesPerEdge._4_4_ = iVar2 + kFinalBytesPerEdge._4_4_;
        sVar4 = std::
                vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                ::size(batches);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_98,sVar4);
        if (*pvVar7 <= kFinalBytesPerEdge._4_4_) {
          BatchDescriptor::BatchDescriptor(&local_c0,(int)shape_1 + 1,kFinalBytesPerEdge._4_4_);
          std::
          vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
          ::push_back(batches,&local_c0);
          kFinalBytesPerEdge._4_4_ = 0;
        }
      }
    }
    sVar4 = std::
            vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
            ::size(&this->shapes_);
    pvVar8 = std::
             vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
             ::back(batches);
    pvVar8->additions_end = (int)sVar4;
    sVar4 = std::
            vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
            ::size(batches);
    if (100 < sVar4) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                 ,0x298,kFatal,(ostream *)&std::cerr);
      poVar9 = S2LogMessage::stream(&local_d8);
      poVar9 = std::operator<<(poVar9,"Check failed: (batches->size()) <= (kMaxUpdateBatches) ");
      S2LogMessageVoidify::operator&(&local_c1,poVar9);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d8);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::GetUpdateBatches(vector<BatchDescriptor>* batches)
    const {
  // Count the edges being removed and added.
  int num_edges_removed = 0;
  if (pending_removals_) {
    for (const auto& pending_removal : *pending_removals_) {
      num_edges_removed += pending_removal.edges.size();
    }
  }
  int num_edges_added = 0;
  for (int id = pending_additions_begin_; id < shapes_.size(); ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    num_edges_added += shape->num_edges();
  }
  int num_edges = num_edges_removed + num_edges_added;

  // The following memory estimates are based on heap profiling.
  //
  // The final size of a MutableS2ShapeIndex depends mainly on how finely the
  // index is subdivided, as controlled by Options::max_edges_per_cell() and
  // --s2shape_index_default_max_edges_per_cell. For realistic values of
  // max_edges_per_cell() and shapes with moderate numbers of edges, it is
  // difficult to get much below 8 bytes per edge.  [The minimum possible size
  // is 4 bytes per edge (to store a 32-bit edge id in an S2ClippedShape) plus
  // 24 bytes per shape (for the S2ClippedShape itself plus a pointer in the
  // shapes_ vector.]
  //
  // The temporary memory consists mainly of the FaceEdge and ClippedEdge
  // structures plus a ClippedEdge pointer for every level of recursive
  // subdivision.  For very large indexes this can be 200 bytes per edge.
  const size_t kFinalBytesPerEdge = 8;
  const size_t kTmpBytesPerEdge = 200;
  const size_t kTmpMemoryBudgetBytes =
      static_cast<size_t>(FLAGS_s2shape_index_tmp_memory_budget_mb) << 20;

  // We arbitrarily limit the number of batches just as a safety measure.
  // With the current default memory budget of 100 MB, this limit is not
  // reached even when building an index of 350 million edges.
  const int kMaxUpdateBatches = 100;

  if (num_edges * kTmpBytesPerEdge <= kTmpMemoryBudgetBytes) {
    // We can update all edges at once without exceeding kTmpMemoryBudgetBytes.
    batches->push_back(BatchDescriptor(shapes_.size(), num_edges));
    return;
  }
  // Otherwise, break the updates into up to several batches, where the size
  // of each batch is chosen so that all batches use approximately the same
  // high-water memory.  GetBatchSizes() returns the recommended number of
  // edges in each batch.
  vector<int> batch_sizes;
  GetBatchSizes(num_edges, kMaxUpdateBatches, kFinalBytesPerEdge,
                kTmpBytesPerEdge, kTmpMemoryBudgetBytes, &batch_sizes);

  // We always process removed edges in a single batch, since (1) they already
  // take up a lot of memory because we have copied all their edges, and (2)
  // AbsorbIndexCell() uses (shapes_[id] == nullptr) to detect when a shape is
  // being removed, so in order to split the removals into batches we would
  // need a different approach (e.g., temporarily add fake entries to shapes_
  // and restore them back to nullptr as shapes are actually removed).
  num_edges = 0;
  if (pending_removals_) {
    num_edges += num_edges_removed;
    if (num_edges >= batch_sizes[0]) {
      batches->push_back(BatchDescriptor(pending_additions_begin_, num_edges));
      num_edges = 0;
    }
  }
  // Keep adding shapes to each batch until the recommended number of edges
  // for that batch is reached, then move on to the next batch.
  for (int id = pending_additions_begin_; id < shapes_.size(); ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= batch_sizes[batches->size()]) {
      batches->push_back(BatchDescriptor(id + 1, num_edges));
      num_edges = 0;
    }
  }
  // Some shapes have no edges.  If a shape with no edges is the last shape to
  // be added or removed, then the final batch may not include it, so we fix
  // that problem here.
  batches->back().additions_end = shapes_.size();
  S2_DCHECK_LE(batches->size(), kMaxUpdateBatches);
}